

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O3

void __thiscall
Indexing::CodeTree::Compiler<false>::handleVar
          (Compiler<false> *this,uint var,Stack<unsigned_int> *globalCounterparts)

{
  uint uVar1;
  bool bVar2;
  uint *in_RAX;
  CodeOp *pCVar3;
  Stack<Indexing::CodeTree::CodeOp> *this_00;
  uint64_t uVar4;
  uint *varNumPtr;
  uint *local_18;
  
  local_18 = in_RAX;
  bVar2 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::getValuePtr
                    (&this->varMap,var,&local_18);
  if (bVar2) {
    uVar1 = this->nextVarNum;
    this->nextVarNum = uVar1 + 1;
    *local_18 = uVar1;
    this_00 = this->code;
    uVar4 = (ulong)uVar1 * 8 + 4;
  }
  else {
    this_00 = this->code;
    uVar4 = (ulong)*local_18 * 8 + 5;
  }
  pCVar3 = this_00->_cursor;
  if (pCVar3 == this_00->_end) {
    Lib::Stack<Indexing::CodeTree::CodeOp>::expand(this_00);
    pCVar3 = this_00->_cursor;
  }
  pCVar3->_content = uVar4;
  pCVar3->_alternative = (CodeOp *)0x0;
  this_00->_cursor = this_00->_cursor + 1;
  return;
}

Assistant:

void CodeTree::Compiler<forLits>::handleVar(unsigned var, Stack<unsigned>* globalCounterparts)
{
  unsigned* varNumPtr;
  if (varMap.getValuePtr(var,varNumPtr)) {
    *varNumPtr = nextVarNum++;
    code.push(CodeOp::getTermOp(ASSIGN_VAR, *varNumPtr));

    if constexpr (forLits) {
      unsigned* globalVarNumPtr;
      if (globalVarMap.getValuePtr(var,globalVarNumPtr)) {
        *globalVarNumPtr = nextGlobalVarNum++;
      }
      globalCounterparts->push(*globalVarNumPtr);
    }
  } else {
    code.push(CodeOp::getTermOp(CHECK_VAR, *varNumPtr));
  }
}